

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzintrulet3d.cpp
# Opt level: O0

void __thiscall
TPZIntRuleT3D::TransformBarycentricCoordInCartesianCoord
          (TPZIntRuleT3D *this,longdouble *baryvec,longdouble *weightvec)

{
  longdouble lVar1;
  longdouble *plVar2;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  int i;
  int local_1c;
  
  for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
    lVar1 = *(longdouble *)(in_RDX + (long)local_1c * 0x10);
    plVar2 = TPZVec<long_double>::operator[]((TPZVec<long_double> *)(in_RDI + 0x94),(long)local_1c);
    *plVar2 = lVar1;
    lVar1 = *(longdouble *)(in_RSI + 0x10 + (long)(local_1c << 2) * 0x10);
    plVar2 = TPZVec<long_double>::operator[]((TPZVec<long_double> *)(in_RDI + 4),(long)local_1c);
    *plVar2 = lVar1;
    lVar1 = *(longdouble *)(in_RSI + 0x20 + (long)(local_1c << 2) * 0x10);
    plVar2 = TPZVec<long_double>::operator[]((TPZVec<long_double> *)(in_RDI + 0x34),(long)local_1c);
    *plVar2 = lVar1;
    lVar1 = *(longdouble *)(in_RSI + 0x30 + (long)(local_1c << 2) * 0x10);
    plVar2 = TPZVec<long_double>::operator[]((TPZVec<long_double> *)(in_RDI + 100),(long)local_1c);
    *plVar2 = lVar1;
  }
  return;
}

Assistant:

void TPZIntRuleT3D::TransformBarycentricCoordInCartesianCoord(long double baryvec[],long double weightvec[]) {
	for(int i=0;i<fNumInt;i++) {
		fWeight[i] = weightvec[i];
		fLocationKsi[i] = baryvec[4*i+1];
		fLocationEta[i] = baryvec[4*i+2];
		fLocationZeta[i] = baryvec[4*i+3];
	}
}